

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

IStreamingReporterPtr __thiscall
Catch::ReporterRegistry::create(ReporterRegistry *this,string *name,IConfigPtr *config)

{
  long *plVar1;
  const_iterator cVar2;
  IConfigPtr *in_RCX;
  ReporterConfig RStack_38;
  
  cVar2 = clara::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
                  *)&name->_M_string_length,(key_type *)config);
  if (cVar2._M_node == (_Base_ptr)&name->field_2) {
    (this->super_IReporterRegistry)._vptr_IReporterRegistry = (_func_int **)0x0;
  }
  else {
    plVar1 = *(long **)(cVar2._M_node + 2);
    ReporterConfig::ReporterConfig(&RStack_38,in_RCX);
    (**(code **)(*plVar1 + 0x10))(this,plVar1,&RStack_38);
    if (RStack_38.m_fullConfig.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (RStack_38.m_fullConfig.
                 super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  return (__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
          )(__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
            )this;
}

Assistant:

IStreamingReporterPtr ReporterRegistry::create( std::string const& name, IConfigPtr const& config ) const {
        auto it =  m_factories.find( name );
        if( it == m_factories.end() )
            return nullptr;
        return it->second->create( ReporterConfig( config ) );
    }